

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::GetTempDirectories
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list)

{
  char *__s;
  int iVar1;
  long lVar2;
  char *candidates [4];
  string dstr;
  stat statbuf;
  char *local_108 [5];
  value_type local_e0;
  stat local_c0;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(list);
  local_108[0] = getenv("TEST_TMPDIR");
  local_108[1] = getenv("TMPDIR");
  local_108[2] = getenv("TMP");
  local_108[3] = "/tmp";
  lVar2 = 0;
  do {
    if (lVar2 == 0x20) {
      return;
    }
    __s = *(char **)((long)local_108 + lVar2);
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,__s,(allocator<char> *)&local_c0);
      if (local_e0._M_dataplus._M_p[local_e0._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)&local_e0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(list,&local_e0);
      iVar1 = stat(__s,&local_c0);
      if ((iVar1 == 0) && ((local_c0.st_mode & 0xf000) == 0x4000)) {
        std::__cxx11::string::~string((string *)&local_e0);
        return;
      }
      std::__cxx11::string::~string((string *)&local_e0);
    }
    lVar2 = lVar2 + 8;
  } while( true );
}

Assistant:

static void GetTempDirectories(vector<string>& list) {
  list.clear();
#ifdef GLOG_OS_WINDOWS
  // On windows we'll try to find a directory in this order:
  //   C:/Documents & Settings/whomever/TEMP (or whatever GetTempPath() is)
  //   C:/TMP/
  //   C:/TEMP/
  char tmp[MAX_PATH];
  if (GetTempPathA(MAX_PATH, tmp)) list.push_back(tmp);
  list.push_back("C:\\TMP\\");
  list.push_back("C:\\TEMP\\");
#else
  // Directories, in order of preference. If we find a dir that
  // exists, we stop adding other less-preferred dirs
  const char* candidates[] = {
      // Non-null only during unittest/regtest
      getenv("TEST_TMPDIR"),

      // Explicitly-supplied temp dirs
      getenv("TMPDIR"),
      getenv("TMP"),

      // If all else fails
      "/tmp",
  };

  for (auto d : candidates) {
    if (!d) continue;  // Empty env var

    // Make sure we don't surprise anyone who's expecting a '/'
    string dstr = d;
    if (dstr[dstr.size() - 1] != '/') {
      dstr += "/";
    }
    list.push_back(dstr);

    struct stat statbuf;
    if (!stat(d, &statbuf) && S_ISDIR(statbuf.st_mode)) {
      // We found a dir that exists - we're done.
      return;
    }
  }
#endif
}